

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6.c
# Opt level: O3

int JsonObjectWalker(unqlite_value *pKey,unqlite_value *pData,void *pUserData)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = unqlite_value_to_string(pKey,(int *)0x0);
  pcVar2 = unqlite_value_to_string(pData,(int *)0x0);
  printf("%s ===> %s\n",pcVar1,pcVar2);
  return 0;
}

Assistant:

static int JsonObjectWalker(unqlite_value *pKey,unqlite_value *pData,void *pUserData /* Unused */)
{
	const char *zKey,*zData;
	/* Extract the key and the data field */
	zKey = unqlite_value_to_string(pKey,0);
	zData = unqlite_value_to_string(pData,0);
	/* Dump */
	printf(
		"%s ===> %s\n",
		zKey,
		zData
	);
	return UNQLITE_OK;
}